

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Security.cpp
# Opt level: O1

uint Security::CalculateConstSize(Opnd *opnd)

{
  _func_int **pp_Var1;
  code *pcVar2;
  bool bVar3;
  OpndKind OVar4;
  undefined4 *puVar5;
  int iVar6;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  uint byteCount;
  uint uVar10;
  
  bVar3 = DontEncode(opnd);
  uVar10 = 0;
  if (!bVar3) {
    OVar4 = IR::Opnd::GetKind(opnd);
    switch(OVar4) {
    case OpndKindIntConst:
      OVar4 = IR::Opnd::GetKind(opnd);
      if (OVar4 != OpndKindIntConst) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar5 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0xc0,"(this->IsIntConstOpnd())","Bad call to AsIntConstOpnd()");
        if (!bVar3) goto LAB_0062b515;
        *puVar5 = 0;
      }
      lVar7 = 0;
      uVar10 = 0;
      do {
        uVar9 = (long)opnd[1]._vptr_Opnd >> ((byte)lVar7 & 0x3f);
        uVar10 = uVar10 + (((uint)uVar9 & 0xff) != 0xff && (uVar9 & 0xff) != 0);
        lVar7 = lVar7 + 8;
      } while (lVar7 != 0x40);
      break;
    case OpndKindInt64Const:
      OVar4 = IR::Opnd::GetKind(opnd);
      if (OVar4 != OpndKindInt64Const) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar5 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0xe4,"(this->IsInt64ConstOpnd())","Bad call to AsInt64ConstOpnd()");
        if (!bVar3) goto LAB_0062b515;
        *puVar5 = 0;
      }
      lVar7 = 0;
      uVar10 = 0;
      do {
        uVar9 = (long)opnd[1]._vptr_Opnd >> ((byte)lVar7 & 0x3f);
        uVar10 = uVar10 + (((uint)uVar9 & 0xff) != 0xff && (uVar9 & 0xff) != 0);
        lVar7 = lVar7 + 8;
      } while (lVar7 != 0x40);
      break;
    default:
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Security.cpp"
                         ,0x15e,"((0))","(0)");
      if (!bVar3) {
LAB_0062b515:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar5 = 0;
      break;
    case OpndKindAddr:
      OVar4 = IR::Opnd::GetKind(opnd);
      if (OVar4 != OpndKindAddr) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar5 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x18e,"(this->IsAddrOpnd())","Bad call to AsAddrOpnd()");
        if (!bVar3) goto LAB_0062b515;
        *puVar5 = 0;
      }
      uVar9 = (ulong)opnd[2]._vptr_Opnd & 0xffff000000000000;
      if (((ulong)opnd[2]._vptr_Opnd & 0x1ffff00000000) != 0x1000000000000 &&
          uVar9 == 0x1000000000000) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar5 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Language/TaggedInt.inl"
                           ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                           "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
        if (!bVar3) goto LAB_0062b515;
        *puVar5 = 0;
      }
      pp_Var1 = opnd[2]._vptr_Opnd;
      if (uVar9 == 0x1000000000000) {
        if (((ulong)pp_Var1 & 0x1ffff00000000) != 0x1000000000000 &&
            ((ulong)pp_Var1 & 0xffff000000000000) == 0x1000000000000) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar5 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Language/TaggedInt.inl"
                             ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                             "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
          if (!bVar3) goto LAB_0062b515;
          *puVar5 = 0;
        }
        if (((ulong)pp_Var1 & 0xffff000000000000) != 0x1000000000000) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar5 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Language/TaggedInt.inl"
                             ,0x43,"(Is(aValue))","Ensure var is actually a \'TaggedInt\'");
          if (!bVar3) goto LAB_0062b515;
          *puVar5 = 0;
        }
        iVar6 = 0;
        uVar10 = 0;
        do {
          uVar8 = (int)pp_Var1 >> ((byte)iVar6 & 0x1f) & 0xff;
          uVar10 = uVar10 + (uVar8 != 0xff && uVar8 != 0);
          iVar6 = iVar6 + 8;
        } while (iVar6 != 0x20);
      }
      else {
        lVar7 = 0;
        uVar10 = 0;
        do {
          uVar9 = (long)pp_Var1 >> ((byte)lVar7 & 0x3f);
          uVar10 = uVar10 + (((uint)uVar9 & 0xff) != 0xff && (uVar9 & 0xff) != 0);
          lVar7 = lVar7 + 8;
        } while (lVar7 != 0x40);
      }
      break;
    case OpndKindIndir:
      OVar4 = IR::Opnd::GetKind(opnd);
      if (OVar4 != OpndKindIndir) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar5 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x1c8,"(this->IsIndirOpnd())","Bad call to AsIndirOpnd()");
        if (!bVar3) goto LAB_0062b515;
        *puVar5 = 0;
      }
      iVar6 = 0;
      uVar10 = 0;
      do {
        uVar8 = *(int *)&opnd[2]._vptr_Opnd >> ((byte)iVar6 & 0x1f) & 0xff;
        uVar10 = uVar10 + (uVar8 != 0xff && uVar8 != 0);
        iVar6 = iVar6 + 8;
      } while (iVar6 != 0x20);
    }
  }
  return uVar10;
}

Assistant:

uint
Security::CalculateConstSize(IR::Opnd *opnd)
{
    if (DontEncode(opnd))
    {
        return 0;
    }
    switch (opnd->GetKind())
    {
#if TARGET_64
    case IR::OpndKindInt64Const:
    {
        IR::Int64ConstOpnd *intConstOpnd = opnd->AsInt64ConstOpnd();
        return GetByteCount(intConstOpnd->GetValue());
    }
#endif
    case IR::OpndKindIntConst:
    {
        IR::IntConstOpnd *intConstOpnd = opnd->AsIntConstOpnd();
        return GetByteCount(intConstOpnd->GetValue());
    }
    case IR::OpndKindAddr:
    {
        IR::AddrOpnd *addrOpnd = opnd->AsAddrOpnd();
        return Js::TaggedInt::Is(addrOpnd->m_address) ? GetByteCount(Js::TaggedInt::ToInt32(addrOpnd->m_address)) : GetByteCount((intptr_t)addrOpnd->m_address);
    }
    case IR::OpndKindIndir:
    {
        IR::IndirOpnd * indirOpnd = opnd->AsIndirOpnd();
        return GetByteCount(indirOpnd->GetOffset());
    }
    default:
        Assume(UNREACHED);
    }
    return 0;
}